

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

void __thiscall TextBuffer::TextBuffer(TextBuffer *this,u16string *text)

{
  allocator<char16_t> local_49;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_48;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_40;
  u16string local_38;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *local_18;
  u16string *text_local;
  TextBuffer *this_local;
  
  local_18 = text;
  text_local = (u16string *)this;
  local_40._M_current =
       (char16_t *)
       std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
       begin(text);
  local_48._M_current =
       (char16_t *)
       std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
       end(local_18);
  std::allocator<char16_t>::allocator(&local_49);
  std::__cxx11::u16string::
  u16string<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,void>
            ((u16string *)&local_38,local_40,local_48,&local_49);
  TextBuffer(this,&local_38);
  std::__cxx11::u16string::~u16string((u16string *)&local_38);
  std::allocator<char16_t>::~allocator(&local_49);
  return;
}

Assistant:

TextBuffer::TextBuffer(const std::u16string &text) :
  TextBuffer{u16string{text.begin(), text.end()}} {}